

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::TiledInputFile::~TiledInputFile(TiledInputFile *this)

{
  _func_int **pp_Var1;
  Data *pDVar2;
  reference ppTVar3;
  GenericInputFile *in_RDI;
  size_t i;
  Data *in_stack_fffffffffffffff0;
  Data *pDVar4;
  
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__TiledInputFile_005626a0;
  if (((ulong)in_RDI[1]._vptr_GenericInputFile[0x2d] & 1) == 0) {
    pDVar4 = (Data *)0x0;
    while (in_stack_fffffffffffffff0 = pDVar4,
          pDVar2 = (Data *)std::
                           vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                           ::size((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                   *)(in_RDI[1]._vptr_GenericInputFile + 0x29)), pDVar4 < pDVar2) {
      ppTVar3 = std::
                vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                              *)(in_RDI[1]._vptr_GenericInputFile + 0x29),
                             (size_type)in_stack_fffffffffffffff0);
      if ((*ppTVar3)->buffer != (char *)0x0) {
        operator_delete__((*ppTVar3)->buffer);
      }
      pDVar4 = (Data *)((long)&(in_stack_fffffffffffffff0->super_Mutex).super___mutex_base._M_mutex
                       + 1);
    }
  }
  if ((((ulong)in_RDI[1]._vptr_GenericInputFile[0x2f] & 1) != 0) &&
     (*(long **)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x28) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x28) + 8))();
  }
  if ((*(int *)(in_RDI[1]._vptr_GenericInputFile + 0x26) == -1) &&
     (in_RDI[1]._vptr_GenericInputFile[0x2e] != (_func_int *)0x0)) {
    operator_delete(in_RDI[1]._vptr_GenericInputFile[0x2e],0x38);
  }
  pp_Var1 = in_RDI[1]._vptr_GenericInputFile;
  if (pp_Var1 != (_func_int **)0x0) {
    Data::~Data(in_stack_fffffffffffffff0);
    operator_delete(pp_Var1,0x180);
  }
  GenericInputFile::~GenericInputFile(in_RDI);
  return;
}

Assistant:

TiledInputFile::~TiledInputFile ()
{
    if (!_data->memoryMapped)
        for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            delete [] _data->tileBuffers[i]->buffer;

    if (_data->_deleteStream)
        delete _data->_streamData->is;

    if (_data->partNumber == -1)
        delete _data->_streamData;

    delete _data;
}